

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O0

void subbid2bid(bid_t subbid,size_t *subblock_no,size_t *idx,bid_t *bid)

{
  byte bVar1;
  uint8_t flag;
  bid_t *bid_local;
  size_t *idx_local;
  size_t *subblock_no_local;
  bid_t subbid_local;
  
  bVar1 = (byte)(subbid >> 0x30);
  *subblock_no = (long)((int)(uint)bVar1 >> 5);
  *subblock_no = *subblock_no - 1;
  *idx = (long)(int)(bVar1 & 0x1f);
  *bid = subbid & 0xffffffffffff;
  return;
}

Assistant:

INLINE void subbid2bid(bid_t subbid, size_t *subblock_no, size_t *idx, bid_t *bid)
{
    uint8_t flag;
    flag = (subbid >> (8 * (sizeof(bid_t)-2))) & 0x00ff;
    *subblock_no = flag >> 5;
    // to distinguish subblock_no==0 to non-subblock
    *subblock_no -= 1;
    *idx = flag & (0x20 - 0x01);
    *bid = ((bid_t)(subbid << 16)) >> 16;
}